

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

Collision * __thiscall
World::findNearestPrimitive(Collision *__return_storage_ptr__,World *this,Ray *ray)

{
  pointer ppPVar1;
  long lVar2;
  double *pdVar3;
  Collision *pCVar4;
  pointer ppPVar5;
  byte bVar6;
  Collision collision;
  double adStack_88 [3];
  char local_70;
  double local_38;
  
  bVar6 = 0;
  Collision::Collision(__return_storage_ptr__,(Primitive *)0x0);
  __return_storage_ptr__->crash = false;
  __return_storage_ptr__->dist = 1e+50;
  ppPVar1 = (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar5 = (this->pris).super__Vector_base<Primitive_*,_std::allocator<Primitive_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar5 != ppPVar1; ppPVar5 = ppPVar5 + 1) {
    (*(*ppPVar5)->_vptr_Primitive[2])(adStack_88,*ppPVar5,ray);
    if ((local_70 == '\x01') && (local_38 < __return_storage_ptr__->dist)) {
      pdVar3 = adStack_88;
      pCVar4 = __return_storage_ptr__;
      for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pCVar4->color).x = *pdVar3;
        pdVar3 = pdVar3 + (ulong)bVar6 * -2 + 1;
        pCVar4 = (Collision *)((long)pCVar4 + (ulong)bVar6 * -0x10 + 8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Collision World::findNearestPrimitive(const Ray &ray) {
    Collision res(nullptr);
    res.crash = false;
    res.dist = INF;
    for (auto i : pris) {
        Collision collision(i->collide(ray));
        if (collision.crash && collision.dist < res.dist)
            res = collision;
    }
    return res;
}